

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O3

void Nwk_ManRemoveDupFanins(Nwk_Man_t *pNtk,int fVerbose)

{
  Nwk_Obj_t *pObj;
  Nwk_Obj_t *pNVar1;
  Nwk_Obj_t *pNVar2;
  Vec_Int_t *vTruth;
  int *__ptr;
  ulong uVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  vTruth = (Vec_Int_t *)malloc(0x10);
  vTruth->nCap = 0x10000;
  vTruth->nSize = 0;
  __ptr = (int *)malloc(0x40000);
  vTruth->pArray = __ptr;
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      pObj = (Nwk_Obj_t *)pVVar4->pArray[lVar6];
      if (((pObj != (Nwk_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x20 & 7) == 3)) &&
         (uVar3 = (ulong)pObj->nFanins, 0 < (long)uVar3)) {
        uVar5 = 1;
        uVar7 = 0;
        do {
          uVar8 = uVar7 + 1;
          if (uVar8 < uVar3) {
            pNVar1 = pObj->pFanio[uVar7];
            uVar9 = uVar5;
            do {
              pNVar2 = pObj->pFanio[uVar9];
              if (pNVar1 == pNVar2) {
                if (fVerbose != 0) {
                  printf("Removing duplicated fanins of node %d (fanins %d and %d).\n",
                         (ulong)(uint)pObj->Id,(ulong)(uint)pNVar1->Id,(ulong)(uint)pNVar2->Id);
                }
                Nwk_ManRemoveDupFaninsNode(pObj,(int)uVar7,(int)uVar9,vTruth);
                pVVar4 = pNtk->vObjs;
                goto LAB_004f23fb;
              }
              uVar9 = uVar9 + 1;
            } while (uVar3 != uVar9);
          }
          uVar5 = uVar5 + 1;
          uVar7 = uVar8;
        } while (uVar8 != uVar3);
      }
LAB_004f23fb:
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar4->nSize);
    __ptr = vTruth->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(vTruth);
  return;
}

Assistant:

void Nwk_ManRemoveDupFanins( Nwk_Man_t * pNtk, int fVerbose )
{
    Vec_Int_t * vTruth;
    Nwk_Obj_t * pObj;
    int i, k, m, fFound;
    // check if the nodes have duplicated fanins
    vTruth = Vec_IntAlloc( 1 << 16 );
    Nwk_ManForEachNode( pNtk, pObj, i )
    {
        fFound = 0;
        for ( k = 0; k < pObj->nFanins; k++ )
        {
            for ( m = k + 1; m < pObj->nFanins; m++ )
                if ( pObj->pFanio[k] == pObj->pFanio[m] )
                {
                    if ( fVerbose )
                        printf( "Removing duplicated fanins of node %d (fanins %d and %d).\n", 
                            pObj->Id, pObj->pFanio[k]->Id, pObj->pFanio[m]->Id );
                    Nwk_ManRemoveDupFaninsNode( pObj, k, m, vTruth );
                    fFound = 1;
                    break;
                }
            if ( fFound )
                break;
        }
    }
    Vec_IntFree( vTruth );
//    Nwk_ManMinimumBase( pNtk, fVerbose );
}